

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitvec.cpp
# Opt level: O2

void rrot1(void *blob,int len,int c)

{
  uint32_t val;
  uint uVar1;
  uint8_t *b;
  bool bVar2;
  
  uVar1 = ~(c >> 0x1f) & c;
  while (bVar2 = uVar1 != 0, uVar1 = uVar1 - 1, bVar2) {
    if (len < 1) {
      val = 0;
    }
    else {
      val = *blob & 1;
    }
    rshift1(blob,len,1);
    setbit(blob,len,len * 8 - 1,val);
  }
  return;
}

Assistant:

void rrot1 ( void * blob, int len, int c )
{
  int nbits = len * 8;

  for(int i = 0; i < c; i++)
  {
    uint32_t bit = getbit(blob,len,0);

    rshift1(blob,len,1);

    setbit(blob,len,nbits-1,bit);
  }
}